

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  path pStack_78;
  undefined1 local_58 [64];
  
  relative_path(&pStack_78,this);
  if (pStack_78._path._M_string_length == 0) {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  else {
    end((iterator *)local_58,this);
    iterator::operator--((iterator *)local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_58 + 0x20));
    std::__cxx11::string::~string((string *)(local_58 + 0x20));
  }
  std::__cxx11::string::~string((string *)&pStack_78);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return relative_path().empty() ? path() : path(*--end());
}